

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O3

void __thiscall
SortedList<MessageQueue::ListEntry>::Insert
          (SortedList<MessageQueue::ListEntry> *this,ListEntry *data)

{
  DListNode<MessageQueue::ListEntry> *pDVar1;
  MessageBase *pMVar2;
  undefined4 uVar3;
  DListNode<MessageQueue::ListEntry> *newNode;
  DListNode<MessageQueue::ListEntry> *node;
  
  pDVar1 = this->head;
  newNode = (DListNode<MessageQueue::ListEntry> *)operator_new(0x20);
  uVar3 = *(undefined4 *)&data->field_0x4;
  pMVar2 = data->message;
  (newNode->data).time = data->time;
  *(undefined4 *)&(newNode->data).field_0x4 = uVar3;
  (newNode->data).message = pMVar2;
  newNode->prev = (DListNode<MessageQueue::ListEntry> *)0x0;
  newNode->next = (DListNode<MessageQueue::ListEntry> *)0x0;
  if ((pDVar1 == (DListNode<MessageQueue::ListEntry> *)0x0) || (data->time < (pDVar1->data).time)) {
    node = (DListNode<MessageQueue::ListEntry> *)0x0;
  }
  else {
    do {
      node = pDVar1;
      pDVar1 = node->next;
      if (pDVar1 == (DListNode<MessageQueue::ListEntry> *)0x0) break;
    } while ((pDVar1->data).time <= data->time);
  }
  InsertAfter(this,newNode,node);
  return;
}

Assistant:

void Insert(const T& data)
    {
        DListNode<T>* curr = head;
        DListNode<T>* node = new DListNode<T>(data);
        DListNode<T>* prev = nullptr; 

        // Now, if we have to insert, we have to insert *after* some node
        while (curr != nullptr)
        {
            if (T::LessThan(data, curr->data))
            {
                break;
            }
            prev = curr;
            curr = curr->next;
        }

        InsertAfter(node, prev);
    }